

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O1

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,CompilationUnitSyntax *syntax)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  size_t sVar5;
  SyntaxNode *node;
  size_t sVar6;
  uint uVar7;
  Token token;
  
  uVar2 = (syntax->endOfFile).field_0x2;
  NVar3.raw = (syntax->endOfFile).numFlags.raw;
  uVar4 = (syntax->endOfFile).rawLen;
  pIVar1 = (syntax->endOfFile).info;
  (this->meta).eofToken.kind = (syntax->endOfFile).kind;
  (this->meta).eofToken.field_0x2 = uVar2;
  (this->meta).eofToken.numFlags = (NumericTokenFlags)NVar3.raw;
  (this->meta).eofToken.rawLen = uVar4;
  (this->meta).eofToken.info = pIVar1;
  sVar5 = slang::syntax::SyntaxNode::getChildCount(&syntax->super_SyntaxNode);
  if (sVar5 != 0) {
    uVar7 = 1;
    sVar5 = 0;
    do {
      node = slang::syntax::SyntaxNode::childNode(&syntax->super_SyntaxNode,sVar5);
      if (node == (SyntaxNode *)0x0) {
        token = slang::syntax::SyntaxNode::childToken(&syntax->super_SyntaxNode,sVar5);
        if (token.info != (Info *)0x0) {
          visitToken(this,token);
        }
      }
      else {
        slang::syntax::detail::
        visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                  (node,this);
      }
      sVar5 = (size_t)uVar7;
      sVar6 = slang::syntax::SyntaxNode::getChildCount(&syntax->super_SyntaxNode);
      uVar7 = uVar7 + 1;
    } while (sVar5 < sVar6);
  }
  return;
}

Assistant:

void handle(const CompilationUnitSyntax& syntax) {
        meta.eofToken = syntax.endOfFile;
        visitDefault(syntax);
    }